

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deDynamicLibrary.c
# Opt level: O1

deDynamicLibrary * deDynamicLibrary_open(char *fileName)

{
  deDynamicLibrary *ptr;
  void *pvVar1;
  
  ptr = (deDynamicLibrary *)deCalloc(8);
  if (ptr != (deDynamicLibrary *)0x0) {
    pvVar1 = (void *)dlopen(fileName,1);
    ptr->libHandle = pvVar1;
    if (pvVar1 != (void *)0x0) {
      return ptr;
    }
    deFree(ptr);
  }
  return (deDynamicLibrary *)0x0;
}

Assistant:

deDynamicLibrary* deDynamicLibrary_open (const char* fileName)
{
	deDynamicLibrary* library = (deDynamicLibrary*)deCalloc(sizeof(deDynamicLibrary));
	if (!library)
		return DE_NULL;

	library->libHandle = dlopen(fileName, RTLD_LAZY);
	if (!library->libHandle)
	{
		deFree(library);
		return DE_NULL;
	}

	return library;
}